

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindWithReplacementScan(Binder *this,ClientContext *context,BaseTableRef *ref)

{
  pointer pRVar1;
  undefined8 this_00;
  BindingMode BVar2;
  DBConfig *pDVar3;
  pointer pTVar4;
  TableFunctionRef *pTVar5;
  SubqueryRef *pSVar6;
  InternalException *this_01;
  long in_RCX;
  pointer pRVar7;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> this_02;
  pointer *__ptr;
  ReplacementScanInput input;
  undefined1 local_98 [72];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  pDVar3 = DBConfig::GetConfig((ClientContext *)ref);
  if (*(char *)((long)&ref[1].super_TableRef.alias._M_string_length + 4) != '\0') {
    pRVar7 = (pDVar3->replacement_scans).
             super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
             super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (pDVar3->replacement_scans).
             super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
             super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pRVar7 != pRVar1) {
      local_98._24_8_ = in_RCX + 0xa8;
      local_98._16_8_ = this;
      local_98._32_8_ = in_RCX;
      local_98._40_8_ = context;
      do {
        local_98._64_8_ = local_98._24_8_;
        local_98._48_8_ = (Logger *)(in_RCX + 0x68);
        local_98._56_8_ = (pointer)(in_RCX + 0x88);
        (*pRVar7->function)((ClientContext *)local_98,(ReplacementScanInput *)ref,
                            (optional_ptr<duckdb::ReplacementScanData,_true>)(local_98 + 0x30));
        this_00 = local_98._40_8_;
        if ((_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
            local_98._0_8_ != (TableRef *)0x0) {
          if (*(long *)(local_98._32_8_ + 0x18) == 0) {
            pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                     operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                 *)local_98);
            this_02._M_head_impl = (BoundTableRef *)local_98._16_8_;
            if ((pTVar4->alias)._M_string_length != 0) goto LAB_00dd0c6d;
            pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                     operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                 *)local_98);
          }
          else {
            pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                     operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                 *)local_98);
            this_02._M_head_impl = (BoundTableRef *)local_98._16_8_;
          }
          ::std::__cxx11::string::_M_assign((string *)&pTVar4->alias);
LAB_00dd0c6d:
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_98);
          if (pTVar4->type == TABLE_FUNCTION) {
            pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                     operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                 *)local_98);
            pTVar5 = TableRef::Cast<duckdb::TableFunctionRef>(pTVar4);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&(pTVar5->super_TableRef).column_name_alias,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_98._32_8_ + 0x50));
          }
          else {
            pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                     operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                 *)local_98);
            if (pTVar4->type != SUBQUERY) {
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              local_50._M_allocated_capacity = (size_type)local_40;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,
                         "Replacement scan should return either a table function or a subquery","");
              InternalException::InternalException(this_01,(string *)&local_50);
              __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                     operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                 *)local_98);
            pSVar6 = TableRef::Cast<duckdb::SubqueryRef>(pTVar4);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&(pSVar6->super_TableRef).column_name_alias,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_98._32_8_ + 0x50));
          }
          BVar2 = GetBindingMode((Binder *)this_00);
          if (BVar2 == EXTRACT_REPLACEMENT_SCANS) {
            pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                     operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                 *)local_98);
            (*pTVar4->_vptr_TableRef[4])(local_98 + 8,pTVar4);
            AddReplacementScan((Binder *)this_00,(string *)local_98._24_8_,
                               (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                                *)(local_98 + 8));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*(*(_func_int ***)local_98._8_8_)[1])();
            }
            local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                    ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                     local_98);
          Bind((Binder *)this_02._M_head_impl,(TableRef *)this_00);
          if ((__uniq_ptr_data<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true,_true>)
              local_98._0_8_ ==
              (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)0x0) {
            return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                    )this_02._M_head_impl;
          }
          (**(code **)(*(long *)local_98._0_8_ + 8))();
          return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                  )this_02._M_head_impl;
        }
        pRVar7 = pRVar7 + 1;
        this = (Binder *)local_98._16_8_;
      } while (pRVar7 != pRVar1);
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
         this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindWithReplacementScan(ClientContext &context, BaseTableRef &ref) {
	auto &config = DBConfig::GetConfig(context);
	if (!context.config.use_replacement_scans) {
		return nullptr;
	}
	for (auto &scan : config.replacement_scans) {
		ReplacementScanInput input(ref.catalog_name, ref.schema_name, ref.table_name);
		auto replacement_function = scan.function(context, input, scan.data.get());
		if (!replacement_function) {
			continue;
		}
		if (!ref.alias.empty()) {
			// user-provided alias overrides the default alias
			replacement_function->alias = ref.alias;
		} else if (replacement_function->alias.empty()) {
			// if the replacement scan itself did not provide an alias we use the table name
			replacement_function->alias = ref.table_name;
		}
		if (replacement_function->type == TableReferenceType::TABLE_FUNCTION) {
			auto &table_function = replacement_function->Cast<TableFunctionRef>();
			table_function.column_name_alias = ref.column_name_alias;
		} else if (replacement_function->type == TableReferenceType::SUBQUERY) {
			auto &subquery = replacement_function->Cast<SubqueryRef>();
			subquery.column_name_alias = ref.column_name_alias;
		} else {
			throw InternalException("Replacement scan should return either a table function or a subquery");
		}
		if (GetBindingMode() == BindingMode::EXTRACT_REPLACEMENT_SCANS) {
			AddReplacementScan(ref.table_name, replacement_function->Copy());
		}
		return Bind(*replacement_function);
	}
	return nullptr;
}